

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O1

void __thiscall xray_re::xr_bone::xr_bone(xr_bone *this)

{
  long lVar1;
  
  this->_vptr_xr_bone = (_func_int **)&PTR__xr_bone_0024a4a8;
  this->m_parent = (xr_bone *)0x0;
  (this->m_children).super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_children).super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_children).super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_parent_name)._M_dataplus._M_p = (pointer)&(this->m_parent_name).field_2;
  (this->m_parent_name)._M_string_length = 0;
  (this->m_parent_name).field_2._M_local_buf[0] = '\0';
  (this->m_vmap_name)._M_dataplus._M_p = (pointer)&(this->m_vmap_name).field_2;
  (this->m_vmap_name)._M_string_length = 0;
  (this->m_vmap_name).field_2._M_local_buf[0] = '\0';
  this->m_bind_length = 0.5;
  (this->m_gamemtl)._M_dataplus._M_p = (pointer)&(this->m_gamemtl).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_gamemtl,"default_object","");
  s_bone_shape::reset(&this->m_shape);
  lVar1 = 0;
  do {
    s_joint_limit::reset
              ((s_joint_limit *)((long)&(this->m_joint_ik_data).limits[0].limit.field_0 + lVar1));
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x30);
  s_joint_ik_data::reset(&this->m_joint_ik_data);
  *(undefined8 *)&this->m_mass = 0x41200000;
  *(undefined8 *)((long)&(this->m_center_of_mass).field_0 + 4) = 0;
  *(undefined8 *)&(this->m_bind_rotate).field_0 = 0;
  *(undefined8 *)((long)&(this->m_bind_rotate).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->m_bind_offset).field_0 + 4) = 0;
  return;
}

Assistant:

xr_bone::xr_bone(): m_parent(0),
	m_bind_length(.5f), m_gamemtl("default_object"), m_mass(10.f)
{
	m_bind_offset.set();
	m_bind_rotate.set();
	m_center_of_mass.set();
}